

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O0

int llhttp__internal__c_mul_add_status_code
              (llhttp__internal_t *state,uchar *p,uchar *endp,int match)

{
  int match_local;
  uchar *endp_local;
  uchar *p_local;
  llhttp__internal_t *state_local;
  int local_4;
  
  if (state->status_code < 0x199a) {
    state->status_code = state->status_code * 10;
    if (match < 0) {
      if ((int)(uint)state->status_code < -match) {
        return 1;
      }
    }
    else if (0xffff - match < (int)(uint)state->status_code) {
      return 1;
    }
    state->status_code = state->status_code + (short)match;
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int llhttp__internal__c_mul_add_status_code(
    llhttp__internal_t* state,
    const unsigned char* p,
    const unsigned char* endp,
    int match) {
  /* Multiplication overflow */
  if (state->status_code > 0xffff / 10) {
    return 1;
  }
  
  state->status_code *= 10;
  
  /* Addition overflow */
  if (match >= 0) {
    if (state->status_code > 0xffff - match) {
      return 1;
    }
  } else {
    if (state->status_code < 0 - match) {
      return 1;
    }
  }
  state->status_code += match;
  return 0;
}